

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLElement * __thiscall tinyxml2::XMLNode::PreviousSiblingElement(XMLNode *this,char *name)

{
  bool bVar1;
  XMLElement *pXVar2;
  char *q;
  char *in_RSI;
  long in_RDI;
  XMLElement *element;
  XMLNode *node;
  long *local_20;
  
  local_20 = *(long **)(in_RDI + 0x40);
  do {
    if (local_20 == (long *)0x0) {
      return (XMLElement *)0x0;
    }
    pXVar2 = (XMLElement *)(**(code **)(*local_20 + 0x30))();
    if (pXVar2 != (XMLElement *)0x0) {
      if (in_RSI == (char *)0x0) {
        return pXVar2;
      }
      q = XMLElement::Name((XMLElement *)0x2c2f38);
      bVar1 = XMLUtil::StringEqual(in_RSI,q,0x7fffffff);
      if (bVar1) {
        return pXVar2;
      }
    }
    local_20 = (long *)local_20[8];
  } while( true );
}

Assistant:

const XMLElement* XMLNode::PreviousSiblingElement( const char* name ) const
{
    for( const XMLNode* node = _prev; node; node = node->_prev ) {
        const XMLElement* element = node->ToElement();
        if ( element
                && (!name || XMLUtil::StringEqual( name, element->Name() ))) {
            return element;
        }
    }
    return 0;
}